

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall ninx::parser::Parser::parse_level_1_expression(Parser *this)

{
  initializer_list<ninx::parser::OperatorCaseDefinition> __l;
  int iVar1;
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  *in_RSI;
  OperatorCaseDefinition *local_190;
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  local_150;
  anon_class_8_1_8991fb9c local_138;
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  local_130;
  allocator<ninx::parser::OperatorCaseDefinition> local_10b;
  undefined1 local_10a;
  allocator local_109;
  string local_108;
  allocator local_d1;
  string local_d0;
  OperatorCaseDefinition *local_b0;
  OperatorCaseDefinition local_a8;
  OperatorCaseDefinition local_68;
  iterator local_28;
  size_type local_20;
  Parser *this_local;
  
  this_local = this;
  if (parse_level_1_expression()::level_1_operators == '\0') {
    iVar1 = __cxa_guard_acquire(&parse_level_1_expression()::level_1_operators);
    if (iVar1 != 0) {
      local_10a = 1;
      local_b0 = &local_a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"*",&local_d1);
      build_operator_case<ninx::parser::element::MultiplicationExpression>(&local_a8,&local_d0);
      local_b0 = &local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"/",&local_109);
      build_operator_case<ninx::parser::element::DivisionExpression>(&local_68,&local_108);
      local_10a = 0;
      local_28 = &local_a8;
      local_20 = 2;
      std::allocator<ninx::parser::OperatorCaseDefinition>::allocator(&local_10b);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::
      vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
      ::vector(&parse_level_1_expression::level_1_operators,__l,&local_10b);
      std::allocator<ninx::parser::OperatorCaseDefinition>::~allocator(&local_10b);
      local_190 = (OperatorCaseDefinition *)&local_28;
      do {
        local_190 = local_190 + -1;
        OperatorCaseDefinition::~OperatorCaseDefinition(local_190);
      } while (local_190 != &local_a8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      __cxa_atexit(std::
                   vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
                   ::~vector,&parse_level_1_expression::level_1_operators,&__dso_handle);
      __cxa_guard_release(&parse_level_1_expression()::level_1_operators);
    }
  }
  std::
  function<std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>()>
  ::function<ninx::parser::Parser::parse_level_1_expression()::__0,void>
            ((function<std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>()>
              *)&local_130,&local_138);
  std::
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  ::vector(&local_150,&parse_level_1_expression::level_1_operators);
  parse_sub_expression
            (this,in_RSI,
             (vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
              *)&local_130);
  std::
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  ::~vector(&local_150);
  std::
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  ::~function(&local_130);
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> ninx::parser::Parser::parse_level_1_expression() {
    static std::vector<ninx::parser::OperatorCaseDefinition> level_1_operators = {
            build_operator_case<MultiplicationExpression>("*"),
            build_operator_case<DivisionExpression>("/")
    };

    return parse_sub_expression([this] {
        return parse_value();
    }, level_1_operators);
}